

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O1

REF_STATUS ref_smooth_geom_edge(REF_GRID ref_grid,REF_INT node)

{
  REF_DBL *pRVar1;
  REF_NODE pRVar2;
  REF_CELL ref_cell;
  REF_GEOM ref_geom;
  REF_ADJ pRVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined8 uVar7;
  ulong uVar8;
  char *pcVar9;
  REF_STATUS ref_private_macro_code_rxs;
  long lVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  REF_INT nodes [2];
  REF_INT id;
  REF_INT sense;
  REF_BOOL geom_node1;
  REF_BOOL geom_node0;
  REF_DBL q;
  REF_DBL t_orig;
  REF_INT nnode;
  REF_BOOL geom_edge;
  REF_BOOL geom_node;
  REF_DBL tangent [3];
  REF_DBL max_ratio;
  REF_DBL min_ratio;
  REF_DBL t;
  REF_DBL min_uv_area;
  REF_DBL normdev;
  REF_DBL normdev_orig;
  REF_DBL q_orig;
  REF_DBL r1orig;
  REF_DBL r0orig;
  REF_DBL r1;
  REF_DBL r0;
  REF_DBL t1;
  REF_DBL t0;
  REF_DBL total_force [3];
  REF_DBL dxyz [3];
  REF_DBL dxyz_dt [6];
  REF_DBL xyz_orig [3];
  REF_INT edge_nodes [27];
  double local_240;
  REF_INT local_234;
  REF_INT local_230;
  REF_INT local_22c;
  REF_NODE local_228;
  REF_INT local_220;
  REF_INT local_21c;
  int local_218;
  int local_214;
  REF_INTERP local_210;
  REF_DBL local_208;
  double local_200;
  int local_1f8;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  double local_1e8;
  undefined8 uStack_1e0;
  long local_1d0;
  double local_1c8;
  double dStack_1c0;
  double local_1b8;
  double local_1a8;
  REF_DBL local_1a0;
  REF_DBL local_198;
  double local_190;
  double local_188;
  double local_180;
  double local_178;
  REF_DBL local_170;
  double local_168;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  double local_140;
  REF_DBL local_138 [4];
  double local_118 [4];
  double local_f8;
  double dStack_f0;
  double local_e8;
  REF_DBL local_c8 [4];
  REF_INT local_a8;
  REF_INT local_a4;
  REF_INT local_a0;
  
  pRVar2 = ref_grid->node;
  ref_cell = ref_grid->cell[0];
  ref_geom = ref_grid->geom;
  local_210 = ref_grid->interp;
  if ((-1 < node) &&
     (((((pRVar3 = ref_grid->cell[6]->ref_adj, node < pRVar3->nnode &&
         (pRVar3->first[(uint)node] != -1)) ||
        ((pRVar3 = ref_grid->cell[9]->ref_adj, node < pRVar3->nnode &&
         (pRVar3->first[(uint)node] != -1)))) ||
       ((pRVar3 = ref_grid->cell[10]->ref_adj, node < pRVar3->nnode &&
        (pRVar3->first[(uint)node] != -1)))) ||
      ((pRVar3 = ref_grid->cell[0xb]->ref_adj, node < pRVar3->nnode &&
       (pRVar3->first[(uint)node] != -1)))))) {
    return 0;
  }
  uVar4 = ref_geom_is_a(ref_geom,node,0,&local_1ec);
  if (uVar4 == 0) {
    local_228 = pRVar2;
    uVar4 = ref_geom_is_a(ref_geom,node,1,&local_1f0);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x607,"ref_smooth_geom_edge",(ulong)uVar4,"edge check");
      return uVar4;
    }
    if (local_1ec == 0) {
      if (local_1f0 != 0) {
        uVar4 = ref_geom_unique_id(ref_geom,node,1,&local_22c);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x60b,"ref_smooth_geom_edge",(ulong)uVar4,"get id");
          return uVar4;
        }
        uVar4 = ref_cell_node_list_around(ref_cell,node,2,&local_1f4,&local_234);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x60c,"ref_smooth_geom_edge",(ulong)uVar4,"edge neighbors");
          return uVar4;
        }
        lVar10 = (long)local_1f4;
        if (lVar10 != 2) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x60d,"ref_smooth_geom_edge","expected two nodes",2,lVar10);
        }
        uVar4 = (uint)(lVar10 != 2);
        if (local_1f4 != 2) {
          return uVar4;
        }
        uVar5 = ref_geom_is_a(ref_geom,local_234,0,&local_214);
        if (uVar5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x610,"ref_smooth_geom_edge",(ulong)uVar5,"node0");
          return uVar5;
        }
        uVar5 = ref_geom_is_a(ref_geom,local_230,0,&local_218);
        if (uVar5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x611,"ref_smooth_geom_edge",(ulong)uVar5,"node1");
          return uVar5;
        }
        local_138[0] = 0.0;
        local_138[1] = 0.0;
        local_138[2] = 0.0;
        if (((local_218 == 0) || (local_214 != 0)) &&
           (uVar5 = ref_smooth_add_pliant_force(local_228,node,local_234,local_138), uVar5 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x616,"ref_smooth_geom_edge",(ulong)uVar5,"n0");
          return uVar5;
        }
        if (((local_214 == 0) || (local_218 != 0)) &&
           (uVar5 = ref_smooth_add_pliant_force(local_228,node,local_230,local_138), uVar5 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x619,"ref_smooth_geom_edge",(ulong)uVar5,"n1");
          return uVar5;
        }
        dVar13 = ref_grid->adapt->smooth_pliant_alpha;
        lVar10 = 0;
        do {
          local_118[lVar10] = local_138[lVar10] * dVar13;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 3);
        local_a8 = local_234;
        local_a0 = local_22c;
        local_a4 = node;
        uVar5 = ref_geom_cell_tuv(ref_geom,local_234,&local_a8,1,&local_140,&local_21c);
        if (uVar5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x627,"ref_smooth_geom_edge",(ulong)uVar5,"get t0");
          ref_node_location(local_228,local_234);
          ref_geom_tattle(ref_geom,local_234);
          return uVar5;
        }
        uVar5 = ref_geom_cell_tuv(ref_geom,node,&local_a8,1,&local_200,&local_21c);
        if (uVar5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x62d,"ref_smooth_geom_edge",(ulong)uVar5,"get t_orig");
          ref_node_location(local_228,node);
          ref_geom_tattle(ref_geom,node);
          return uVar5;
        }
        local_a8 = local_230;
        local_a0 = local_22c;
        local_a4 = node;
        uVar5 = ref_geom_cell_tuv(ref_geom,local_230,&local_a8,1,&local_148,&local_21c);
        if (uVar5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x636,"ref_smooth_geom_edge",(ulong)uVar5,"get t1");
          ref_node_location(local_228,local_230);
          ref_geom_tattle(ref_geom,local_230);
          return uVar5;
        }
        uVar5 = ref_egads_eval_at(ref_geom,1,local_22c,&local_200,local_c8,&local_f8);
        if (uVar5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x63a,"ref_smooth_geom_edge",(ulong)uVar5,"eval edge derivatives");
          return uVar5;
        }
        local_1b8 = local_e8;
        local_1c8 = local_f8;
        dStack_1c0 = dStack_f0;
        local_1e8 = local_e8 * local_e8 + local_f8 * local_f8 + dStack_f0 * dStack_f0;
        if (local_1e8 < 0.0) {
          local_1e8 = sqrt(local_1e8);
        }
        else {
          local_1e8 = SQRT(local_1e8);
        }
        uVar5 = ref_math_normalize(&local_1c8);
        if (uVar5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x63d,"ref_smooth_geom_edge",(ulong)uVar5,"form tangent");
          return uVar5;
        }
        dVar15 = local_118[2] * local_1b8 + local_118[0] * local_1c8 + local_118[1] * dStack_1c0;
        dVar13 = local_1e8 * 1e+20;
        if (dVar13 <= -dVar13) {
          dVar13 = -dVar13;
        }
        dVar14 = dVar15;
        if (dVar15 <= -dVar15) {
          dVar14 = -dVar15;
        }
        if (dVar14 < dVar13) {
          local_1e8 = dVar15 / local_1e8 + local_200;
          uVar11 = SUB84(local_140,0);
          uVar12 = (undefined4)((ulong)local_140 >> 0x20);
          dVar13 = local_140;
          if (local_148 <= local_140) {
            dVar13 = local_148;
          }
          uStack_1e0 = 0;
          if (local_1e8 < dVar13) {
            return 0;
          }
          if (local_140 <= local_148) {
            uVar11 = SUB84(local_148,0);
            uVar12 = (undefined4)((ulong)local_148 >> 0x20);
          }
          if ((double)CONCAT44(uVar12,uVar11) <= local_1e8 &&
              local_1e8 != (double)CONCAT44(uVar12,uVar11)) {
            return 0;
          }
          uVar5 = ref_node_ratio(local_228,local_234,node,&local_160);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                   ,0x650,"ref_smooth_geom_edge",(ulong)uVar5,"get r0");
            return uVar5;
          }
          uVar5 = ref_node_ratio(local_228,local_230,node,&local_168);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                   ,0x651,"ref_smooth_geom_edge",(ulong)uVar5,"get r1");
            return uVar5;
          }
          if (ref_grid->surf == 0) {
            uVar5 = ref_smooth_tet_quality_around(ref_grid,node,&local_170);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x655,"ref_smooth_geom_edge",(ulong)uVar5,"q_orig");
              return uVar5;
            }
          }
          else {
            local_170 = 1.0;
          }
          uVar5 = ref_smooth_tri_normdev_around(ref_grid,node,&local_178);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                   ,0x657,"ref_smooth_geom_edge",(ulong)uVar5,"nd_orig");
            return uVar5;
          }
          local_220 = -1;
          local_1d0 = (long)node;
          if ((local_210 != (REF_INTERP)0x0) && (local_210->continuously != 0)) {
            local_220 = local_210->cell[local_1d0];
          }
          local_1a8 = local_178;
          local_1f8 = 8;
          local_240 = 1.0;
          do {
            local_190 = local_240 * local_1e8 + (1.0 - local_240) * local_200;
            uVar5 = ref_geom_add(ref_geom,node,1,local_22c,&local_190);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x66a,"ref_smooth_geom_edge",(ulong)uVar5,"set t");
              return uVar5;
            }
            uVar5 = ref_geom_constrain(ref_grid,node);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x66b,"ref_smooth_geom_edge",(ulong)uVar5,"constrain");
              return uVar5;
            }
            uVar5 = ref_metric_interpolate_node(ref_grid,node);
            if ((uVar5 != 0) && (uVar5 != 5)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x66d,"ref_smooth_geom_edge",(ulong)uVar5,"ref_metric_interpolate_node failed"
                    );
              uVar4 = uVar5;
            }
            if ((uVar5 != 5) && (uVar5 != 0)) {
              return uVar4;
            }
            uVar6 = ref_node_ratio(local_228,local_234,node,&local_150);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x66e,"ref_smooth_geom_edge",(ulong)uVar6,"get r0");
              return uVar6;
            }
            uVar6 = ref_node_ratio(local_228,local_230,node,&local_158);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x66f,"ref_smooth_geom_edge",(ulong)uVar6,"get r1");
              return uVar6;
            }
            if (ref_grid->surf == 0) {
              uVar6 = ref_smooth_tet_quality_around(ref_grid,node,&local_208);
              if (uVar6 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,0x675,"ref_smooth_geom_edge",(ulong)uVar6,"q");
                return uVar6;
              }
              uVar6 = ref_smooth_tet_ratio_around(ref_grid,node,&local_198,&local_1a0);
              if (uVar6 != 0) {
                uVar7 = 0x677;
                uVar4 = uVar6;
                goto LAB_001e0919;
              }
            }
            else {
              local_208 = 1.0;
              uVar6 = ref_smooth_tri_ratio_around(ref_grid,node,&local_198,&local_1a0);
              if (uVar6 != 0) {
                uVar7 = 0x673;
                uVar4 = uVar6;
LAB_001e0919:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,uVar7,"ref_smooth_geom_edge",(ulong)uVar4,"ratio");
                uVar6 = uVar4;
              }
            }
            if (uVar6 != 0) {
              return uVar4;
            }
            uVar6 = ref_smooth_tri_normdev_around(ref_grid,node,&local_180);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x679,"ref_smooth_geom_edge",(ulong)uVar6,"nd");
              return uVar6;
            }
            uVar6 = ref_smooth_tri_uv_area_around(ref_grid,node,&local_188);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x67a,"ref_smooth_geom_edge",(ulong)uVar6,"a");
              return uVar6;
            }
            pRVar1 = &ref_grid->adapt->smooth_min_quality;
            if ((*pRVar1 <= local_208 && local_208 != *pRVar1) &&
               (((pRVar1 = &ref_grid->adapt->post_min_normdev,
                 *pRVar1 <= local_180 && local_180 != *pRVar1 || (local_1a8 < local_180)) &&
                (local_228->min_uv_area <= local_188 && local_188 != local_228->min_uv_area)))) {
              uVar11 = SUB84(local_150,0);
              uVar12 = (undefined4)((ulong)local_150 >> 0x20);
              dVar13 = local_150;
              if (local_158 <= local_150) {
                dVar13 = local_158;
              }
              dVar15 = local_160;
              if (local_168 <= local_160) {
                dVar15 = local_168;
              }
              if (dVar15 * 0.9 < dVar13) {
                if (local_150 <= local_158) {
                  uVar11 = SUB84(local_158,0);
                  uVar12 = (undefined4)((ulong)local_158 >> 0x20);
                }
                dVar13 = local_160;
                if (local_160 <= local_168) {
                  dVar13 = local_168;
                }
                if ((double)CONCAT44(uVar12,uVar11) <= dVar13 * 1.1 &&
                    dVar13 * 1.1 != (double)CONCAT44(uVar12,uVar11)) {
                  return 0;
                }
              }
            }
            local_240 = local_240 * 0.5;
            if (uVar5 != 0 && local_220 != -1) {
              local_210->cell[local_1d0] = local_220;
            }
            local_1f8 = local_1f8 + -1;
            if (local_1f8 == 0) {
              uVar5 = ref_geom_add(ref_geom,node,1,local_22c,&local_200);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,0x68c,"ref_smooth_geom_edge",(ulong)uVar5,"set t");
                return uVar5;
              }
              uVar5 = ref_geom_constrain(ref_grid,node);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,0x68d,"ref_smooth_geom_edge",(ulong)uVar5,"constrain");
                return uVar5;
              }
              uVar5 = ref_metric_interpolate_node(ref_grid,node);
              if ((uVar5 != 0) && (uVar5 != 5)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,0x68e,"ref_smooth_geom_edge",(ulong)uVar5,"interp");
                uVar4 = uVar5;
              }
              if ((uVar5 != 5) && (uVar5 != 0)) {
                return uVar4;
              }
              if (ref_grid->surf != 0) {
                return 0;
              }
              uVar4 = ref_smooth_tet_quality_around(ref_grid,node,&local_208);
              if (uVar4 == 0) {
                return 0;
              }
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x693,"ref_smooth_geom_edge",(ulong)uVar4,"q");
              return uVar4;
            }
          } while( true );
        }
        pcVar9 = "unable to invert dt/dxyz";
        uVar4 = 4;
        uVar7 = 0x642;
        uVar8 = 4;
        goto LAB_001dfe1d;
      }
      pcVar9 = "geom edge required";
      uVar7 = 0x609;
    }
    else {
      pcVar9 = "geom node not allowed";
      uVar7 = 0x608;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",uVar7,
           "ref_smooth_geom_edge",pcVar9);
    uVar4 = 1;
  }
  else {
    pcVar9 = "node check";
    uVar7 = 0x606;
    uVar8 = (ulong)uVar4;
LAB_001dfe1d:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",uVar7,
           "ref_smooth_geom_edge",uVar8,pcVar9);
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_geom_edge(REF_GRID ref_grid, REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL edg = ref_grid_edg(ref_grid);
  REF_BOOL geom_node, geom_node0, geom_node1, geom_edge;
  REF_INT id;
  REF_INT nodes[2], nnode;
  REF_DBL t_orig, t0, t1;
  REF_DBL r0, r1, r0orig, r1orig;
  REF_DBL q_orig;
  REF_DBL normdev_orig, normdev;
  REF_DBL min_uv_area;

  REF_INT ixyz;
  REF_DBL total_force[3];
  REF_DBL dxyz[3], dxyz_dt[6], xyz_orig[3], dt, dt_ds, tangent[3];

  REF_DBL t, q, backoff, t_target, min_ratio, max_ratio;
  REF_INT tries;
  REF_BOOL verbose = REF_FALSE;
  REF_INT edge_nodes[REF_CELL_MAX_SIZE_PER], sense;

  REF_STATUS interp_status;
  REF_INT interp_guess;
  REF_INTERP ref_interp = ref_grid_interp(ref_grid);
  REF_BOOL accept;

  if (!ref_cell_node_empty(ref_grid_qua(ref_grid), node)) return REF_SUCCESS;
  if (!ref_cell_node_empty(ref_grid_pyr(ref_grid), node)) return REF_SUCCESS;
  if (!ref_cell_node_empty(ref_grid_pri(ref_grid), node)) return REF_SUCCESS;
  if (!ref_cell_node_empty(ref_grid_hex(ref_grid), node)) return REF_SUCCESS;

  RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_NODE, &geom_node), "node check");
  RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_EDGE, &geom_edge), "edge check");
  RAS(!geom_node, "geom node not allowed");
  RAS(geom_edge, "geom edge required");

  RSS(ref_geom_unique_id(ref_geom, node, REF_GEOM_EDGE, &id), "get id");
  RSS(ref_cell_node_list_around(edg, node, 2, &nnode, nodes), "edge neighbors");
  REIS(2, nnode, "expected two nodes");

  /* if node0 or node1 constrained by geometry, give precedence */
  RSS(ref_geom_is_a(ref_geom, nodes[0], REF_GEOM_NODE, &geom_node0), "node0");
  RSS(ref_geom_is_a(ref_geom, nodes[1], REF_GEOM_NODE, &geom_node1), "node1");

  for (ixyz = 0; ixyz < 3; ixyz++) total_force[ixyz] = 0.0;
  if (!geom_node1 || (geom_node0 && geom_node1))
    RSS(ref_smooth_add_pliant_force(ref_node, node, nodes[0], total_force),
        "n0");
  if (!geom_node0 || (geom_node0 && geom_node1))
    RSS(ref_smooth_add_pliant_force(ref_node, node, nodes[1], total_force),
        "n1");

  for (ixyz = 0; ixyz < 3; ixyz++)
    dxyz[ixyz] =
        ref_grid_adapt(ref_grid, smooth_pliant_alpha) * total_force[ixyz];

  edge_nodes[0] = nodes[0];
  edge_nodes[1] = node;
  edge_nodes[2] = id;
  RSB(ref_geom_cell_tuv(ref_geom, nodes[0], edge_nodes, REF_GEOM_EDGE, &t0,
                        &sense),
      "get t0", {
        ref_node_location(ref_node, nodes[0]);
        ref_geom_tattle(ref_geom, nodes[0]);
      });
  RSB(ref_geom_cell_tuv(ref_geom, node, edge_nodes, REF_GEOM_EDGE, &t_orig,
                        &sense),
      "get t_orig", {
        ref_node_location(ref_node, node);
        ref_geom_tattle(ref_geom, node);
      });
  edge_nodes[0] = nodes[1];
  edge_nodes[1] = node;
  edge_nodes[2] = id;
  RSB(ref_geom_cell_tuv(ref_geom, nodes[1], edge_nodes, REF_GEOM_EDGE, &t1,
                        &sense),
      "get t1", {
        ref_node_location(ref_node, nodes[1]);
        ref_geom_tattle(ref_geom, nodes[1]);
      });

  RSS(ref_egads_eval_at(ref_geom, REF_GEOM_EDGE, id, &t_orig, xyz_orig,
                        dxyz_dt),
      "eval edge derivatives");
  for (ixyz = 0; ixyz < 3; ixyz++) tangent[ixyz] = dxyz_dt[ixyz];
  dt_ds = sqrt(ref_math_dot(dxyz_dt, dxyz_dt));
  RSS(ref_math_normalize(tangent), "form tangent");
  dt = ref_math_dot(dxyz, tangent);
  if (ref_math_divisible(dt, dt_ds)) {
    dt /= dt_ds;
  } else {
    RSS(REF_DIV_ZERO, "unable to invert dt/dxyz");
  }
  t_target = t_orig + dt;

  /* reject a smooth point candidate outside of trange */
  if (t_target < MIN(t0, t1) || MAX(t0, t1) < t_target) {
    return REF_SUCCESS;
  }

  if (verbose) {
    printf("dxyz %f %f %f\n", dxyz[0], dxyz[1], dxyz[2]);
    printf("dxyz_dt %f %f %f\n", dxyz_dt[0], dxyz_dt[1], dxyz_dt[2]);
  }

  RSS(ref_node_ratio(ref_node, nodes[0], node, &r0orig), "get r0");
  RSS(ref_node_ratio(ref_node, nodes[1], node, &r1orig), "get r1");
  if (ref_grid_surf(ref_grid)) {
    q_orig = 1.0;
  } else {
    RSS(ref_smooth_tet_quality_around(ref_grid, node, &q_orig), "q_orig");
  }
  RSS(ref_smooth_tri_normdev_around(ref_grid, node, &normdev_orig), "nd_orig");
  interp_guess = REF_EMPTY;
  if (NULL != ref_interp) {
    if (ref_interp_continuously(ref_interp)) {
      interp_guess = ref_interp_cell(ref_interp, node);
    }
  }

  if (verbose) printf("edge %d t %f %f %f q %f\n", id, t0, t_orig, t1, q_orig);

  if (verbose)
    printf("t_target %f at %f %f %f\n", t_target,
           ref_node_xyz(ref_node, 0, node), ref_node_xyz(ref_node, 1, node),
           ref_node_xyz(ref_node, 2, node));

  backoff = 1.0;
  for (tries = 0; tries < 8; tries++) {
    t = backoff * t_target + (1.0 - backoff) * t_orig;

    RSS(ref_geom_add(ref_geom, node, REF_GEOM_EDGE, id, &t), "set t");
    RSS(ref_geom_constrain(ref_grid, node), "constrain");
    interp_status = ref_metric_interpolate_node(ref_grid, node);
    RXS(interp_status, REF_NOT_FOUND, "ref_metric_interpolate_node failed");
    RSS(ref_node_ratio(ref_node, nodes[0], node, &r0), "get r0");
    RSS(ref_node_ratio(ref_node, nodes[1], node, &r1), "get r1");
    if (ref_grid_surf(ref_grid)) {
      q = 1.0;
      RSS(ref_smooth_tri_ratio_around(ref_grid, node, &min_ratio, &max_ratio),
          "ratio");
    } else {
      RSS(ref_smooth_tet_quality_around(ref_grid, node, &q), "q");
      RSS(ref_smooth_tet_ratio_around(ref_grid, node, &min_ratio, &max_ratio),
          "ratio");
    }
    RSS(ref_smooth_tri_normdev_around(ref_grid, node, &normdev), "nd");
    RSS(ref_smooth_tri_uv_area_around(ref_grid, node, &min_uv_area), "a");

    accept = (q > ref_grid_adapt(ref_grid, smooth_min_quality));
    accept = accept && (normdev > ref_grid_adapt(ref_grid, post_min_normdev) ||
                        normdev > normdev_orig);
    accept = accept && (min_uv_area > ref_node_min_uv_area(ref_node));
    accept = accept && (MIN(r0, r1) > 0.9 * MIN(r0orig, r1orig));
    accept = accept && (MAX(r0, r1) < 1.1 * MAX(r0orig, r1orig));

    if (verbose) printf("t %f r %f %f q %f \n", t, r0, r1, q);
    if (accept) {
      return REF_SUCCESS;
    }
    backoff *= 0.5;
    if (REF_EMPTY != interp_guess && REF_SUCCESS != interp_status)
      ref_interp_cell(ref_interp, node) = interp_guess;
  }

  RSS(ref_geom_add(ref_geom, node, REF_GEOM_EDGE, id, &t_orig), "set t");
  RSS(ref_geom_constrain(ref_grid, node), "constrain");
  RXS(ref_metric_interpolate_node(ref_grid, node), REF_NOT_FOUND, "interp");

  if (ref_grid_surf(ref_grid)) {
    q = 1.0;
  } else {
    RSS(ref_smooth_tet_quality_around(ref_grid, node, &q), "q");
  }
  if (verbose) printf("undo q %f\n", q);

  return REF_SUCCESS;
}